

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O2

void __thiscall Sequence::Sequence(Sequence *this,int t_size)

{
  deque<int,_std::allocator<int>_> *this_00;
  result_type *prVar1;
  uint uVar2;
  result_type rVar3;
  result_type *prVar4;
  result_type *prVar5;
  _Map_pointer ppiVar6;
  anon_class_5008_2_615ce6dd wrapped;
  allocator_type local_2759;
  deque<int,_std::allocator<int>_> *local_2758;
  undefined1 local_2750 [5008];
  undefined8 local_13c0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  this->_vptr_Sequence = (_func_int **)&PTR_shift_00114d18;
  this_00 = &this->m_bits;
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            (&this_00->super__Deque_base<int,_std::allocator<int>_>);
  local_2758 = this_00;
  std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)local_2750,(long)t_size,&local_2759);
  std::deque<int,_std::allocator<int>_>::_M_move_assign1
            (this_00,(_Deque_base<int,_std::allocator<int>_> *)local_2750);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_2750);
  local_13c0 = 0x100000000;
  std::random_device::random_device((random_device *)local_2750);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar2);
  std::random_device::~random_device((random_device *)local_2750);
  memcpy(local_2750,&local_13c0,0x1390);
  prVar5 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  prVar4 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  ppiVar6 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  prVar1 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while (prVar5 != prVar1) {
    rVar3 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)local_2750,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(local_2750 + 8));
    *prVar5 = rVar3;
    prVar5 = prVar5 + 1;
    if (prVar5 == prVar4) {
      prVar5 = ppiVar6[1];
      ppiVar6 = ppiVar6 + 1;
      prVar4 = prVar5 + 0x80;
    }
  }
  return;
}

Assistant:

Sequence::Sequence(int t_size) {
    m_bits = std::deque<int>(t_size);

    // Lambda function to generate random bits
    auto rand_between = [](int low, int high) {
        auto wrapped = [distribution_ = std::uniform_int_distribution<int>(low, high),
                        random_engine_ = std::mt19937{std::random_device{}()}]() mutable {
            return distribution_(random_engine_);
        };
        return wrapped;
    };

    std::ranges::generate(m_bits, rand_between(0, 1));
}